

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

CScript * GetScriptForRawPubKey(CScript *__return_storage_ptr__,CPubKey *pubKey)

{
  byte bVar1;
  CScript *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long lVar2;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  allocator_type local_51;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined1 local_38 [40];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = 0;
  local_38._24_8_ = 0;
  local_38._0_8_ = (char *)0x0;
  local_38._8_8_ = 0;
  if ((pubKey->vch[0] & 0xfe) == 2) {
    lVar2 = 0x21;
  }
  else {
    bVar1 = pubKey->vch[0] - 4;
    if (bVar1 < 4) {
      lVar2 = *(long *)(&DAT_003f01e0 + (ulong)bVar1 * 8);
    }
    else {
      lVar2 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,pubKey->vch,
             pubKey->vch + lVar2,&local_51);
  b._M_extent._M_extent_value =
       (long)local_50._M_impl.super__Vector_impl_data._M_finish -
       (long)local_50._M_impl.super__Vector_impl_data._M_start;
  b._M_ptr = local_50._M_impl.super__Vector_impl_data._M_start;
  this = CScript::operator<<((CScript *)local_38,b);
  other = &CScript::operator<<(this,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&__return_storage_ptr__->super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript GetScriptForRawPubKey(const CPubKey& pubKey)
{
    return CScript() << std::vector<unsigned char>(pubKey.begin(), pubKey.end()) << OP_CHECKSIG;
}